

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::mid(QByteArray *this,qsizetype pos,qsizetype len)

{
  CutResult CVar1;
  qsizetype originalLength;
  QByteArray *this_00;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qsizetype l;
  qsizetype p;
  QByteArray *this_01;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  originalLength = size(in_RSI);
  CVar1 = QtPrivate::QContainerImplHelper::mid(originalLength,&local_10,&local_18);
  this_00 = (QByteArray *)(ulong)CVar1;
  switch(this_00) {
  case (QByteArray *)0x0:
    QByteArray((QByteArray *)0x1c28c6);
    break;
  case (QByteArray *)0x1:
    resize(this_00,(qsizetype)in_RSI);
  case (QByteArray *)0x2:
    QByteArray(this_01,in_RDI);
    break;
  case (QByteArray *)0x3:
    sliced(this_00,(qsizetype)in_RSI,(qsizetype)this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_01;
}

Assistant:

QByteArray QByteArray::mid(qsizetype pos, qsizetype len) &&
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(size(), &p, &l)) {
    case QContainerImplHelper::Null:
        return QByteArray();
    case QContainerImplHelper::Empty:
        resize(0);      // keep capacity if we've reserve()d
        [[fallthrough]];
    case QContainerImplHelper::Full:
        return std::move(*this);
    case QContainerImplHelper::Subset:
        return std::move(*this).sliced(p, l);
    }
    Q_UNREACHABLE_RETURN(QByteArray());
}